

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O2

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::oneTaskDone(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  pointer ptVar3;
  pointer ptVar4;
  scheduler<concurrent_queue> *hTask;
  bool bVar5;
  __shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  LOCK();
  paVar1 = &this->activeTasksCount_;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) {
    task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
    ::notifyGroupDone(&this->
                       super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                     );
    return;
  }
  if (0 < this->maxSimultaneousTasks_) {
    ptVar3 = (this->tasks_).
             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar4 = (this->tasks_).
             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      LOCK();
      paVar1 = &this->currentTaskIndex_;
      uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if ((ulong)((long)ptVar3 - (long)ptVar4 >> 4) <= uVar2) {
        return;
      }
      bVar5 = task_handle::isGrabbed
                        ((this->tasks_).
                         super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar2);
    } while ((bVar5) ||
            (bVar5 = task_handle::isDone((this->tasks_).
                                         super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar2), bVar5))
    ;
    hTask = (this->
            super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
            ).scheduler_;
    std::__shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->tasks_).
                super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                super__Vector_impl_data._M_start + uVar2));
    scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)&stack0xffffffffffffffd0,(task_handle *)hTask);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

virtual void oneTaskDone() override final
        {
            const auto previousTaskCount = activeTasksCount_.fetch_sub(1);
            if (previousTaskCount == 1)
            {
                this->notifyGroupDone();
            }
            else if (maxSimultaneousTasks_ > 0)
            {
                const auto taskCount = tasks_.size();
                size_t i = 0;
                while ((i = currentTaskIndex_.fetch_add(1)) < taskCount)
                {
                    if (!tasks_[i].isGrabbed() && !tasks_[i].isDone())
                    {
                        this->scheduler_.add(tasks_[i]);
                        break;
                    }
                }
            }
        }